

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d5768::CAPIBuildEngineDelegate::cycleDetected
          (CAPIBuildEngineDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  _func_void_void_ptr_llb_data_t_ptr_uint64_t *p_Var1;
  void *pvVar2;
  pointer this_00;
  bool bVar3;
  size_type sVar4;
  reference ppRVar5;
  llb_data_t_ *plVar6;
  value_type local_68;
  KeyType *local_58;
  KeyType *key;
  Rule *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *__range2;
  vector<llb_data_t_,_std::allocator<llb_data_t_>_> keys;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items_local;
  CAPIBuildEngineDelegate *this_local;
  
  keys.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)items;
  std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::vector
            ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2);
  sVar4 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::size
                    ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                     keys.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::reserve
            ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2,sVar4);
  this_00 = keys.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::begin
                     ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                      keys.super__Vector_base<llb_data_t_,_std::allocator<llb_data_t_>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  item = (Rule *)std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::end
                           ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *
                            )this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
                                *)&item);
    if (!bVar3) break;
    ppRVar5 = __gnu_cxx::
              __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
              ::operator*(&__end2);
    key = (KeyType *)*ppRVar5;
    local_58 = &((Rule *)key)->key;
    local_68.length = llbuild::core::KeyType::size(local_58);
    local_68.data = (uint8_t *)llbuild::core::KeyType::data(local_58);
    std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::push_back
              ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2,&local_68);
    __gnu_cxx::
    __normal_iterator<llbuild::core::Rule_*const_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
    ::operator++(&__end2);
  }
  p_Var1 = (this->cAPIDelegate).cycle_detected;
  pvVar2 = (this->cAPIDelegate).context;
  plVar6 = std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::data
                     ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2);
  sVar4 = std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::size
                    ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2);
  (*p_Var1)(pvVar2,plVar6,sVar4);
  std::vector<llb_data_t_,_std::allocator<llb_data_t_>_>::~vector
            ((vector<llb_data_t_,_std::allocator<llb_data_t_>_> *)&__range2);
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    std::vector<llb_data_t> keys;
    keys.reserve(items.size());
    for (auto item : items) {
      const KeyType &key = item->key;
      keys.push_back({ key.size(), (const uint8_t*)key.data() });
    }

    cAPIDelegate.cycle_detected(cAPIDelegate.context, keys.data(), keys.size());
  }